

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_scalar.cpp
# Opt level: O1

extent_float_t __thiscall
ear::PolarExtentCoreScalar::weight_circle
          (PolarExtentCoreScalar *this,PolarExtentCoreContext *ctx,ExtentPosition *position)

{
  float fVar1;
  float fVar2;
  extent_float_t eVar3;
  
  fVar2 = position->z * ctx->flippedBasis[5] +
          position->x * ctx->flippedBasis[3] + position->y * ctx->flippedBasis[4];
  if (ctx->cos_start_angle <= fVar2) {
    eVar3 = 1.0;
  }
  else {
    eVar3 = 0.0;
    if (ctx->cos_end_angle < fVar2) {
      fVar1 = ctx->m;
      fVar2 = acosf(fVar2);
      eVar3 = fVar2 * fVar1 + ctx->c;
    }
  }
  return eVar3;
}

Assistant:

extent_float_t dot(const extent_float_t *vec) const {
      return x * vec[0] + y * vec[1] + z * vec[2];
    }